

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

bool RunCommand(char *comment,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *command,bool verbose,NumberFormat exitFormat,int *retCodeOut,
               _func_bool_int *retCodeOkay)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command_00;
  ostream *poVar2;
  long lVar3;
  bool local_f4;
  bool local_f2;
  bool local_f1;
  NumberFormatter local_c0;
  string local_b8;
  bool local_92;
  undefined1 local_91;
  bool success;
  duration<double,_std::ratio<1L,_1L>_> dStack_90;
  bool retCodeSuccess;
  byte local_85;
  int local_84;
  undefined1 local_80 [3];
  bool commandResult;
  int retCode;
  string output;
  string local_50;
  _func_bool_int *local_30;
  _func_bool_int *retCodeOkay_local;
  int *retCodeOut_local;
  NumberFormat exitFormat_local;
  bool verbose_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command_local;
  char *comment_local;
  
  local_30 = retCodeOkay;
  retCodeOkay_local = (_func_bool_int *)retCodeOut;
  retCodeOut_local._0_4_ = exitFormat;
  retCodeOut_local._7_1_ = verbose;
  _exitFormat_local = command;
  command_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)comment;
  if (verbose) {
    poVar2 = std::operator<<((ostream *)&std::cout,comment);
    std::operator<<(poVar2,":\n");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_50,_exitFormat_local," ");
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::string((string *)local_80);
  command_00 = _exitFormat_local;
  local_84 = 0;
  dStack_90 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  local_85 = cmSystemTools::RunSingleCommand
                       (command_00,(string *)local_80,(string *)local_80,&local_84,(char *)0x0,
                        OUTPUT_NONE,(cmDuration)dStack_90.__r,Auto);
  local_f1 = true;
  if (local_84 != 0) {
    local_f2 = false;
    if (local_30 != (_func_bool_int *)0x0) {
      local_f2 = (*local_30)(local_84);
    }
    local_f1 = local_f2;
  }
  local_91 = local_f1;
  local_f4 = false;
  if ((local_85 & 1) != 0) {
    local_f4 = (bool)local_91;
  }
  local_92 = local_f4;
  if (retCodeOkay_local != (_func_bool_int *)0x0) {
    if (((local_85 & 1) == 0) && (local_f1 != false)) {
      *(undefined4 *)retCodeOkay_local = 0xffffffff;
    }
    else {
      *(int *)retCodeOkay_local = local_84;
    }
  }
  if (local_f4 == false) {
    poVar2 = std::operator<<((ostream *)&std::cout,(char *)command_local);
    poVar2 = std::operator<<(poVar2,": command \"");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_b8,_exitFormat_local," ");
    poVar2 = std::operator<<(poVar2,(string *)&local_b8);
    poVar2 = std::operator<<(poVar2,"\" failed (exit code ");
    NumberFormatter::NumberFormatter(&local_c0,(NumberFormat)retCodeOut_local,local_84);
    poVar2 = operator<<(poVar2,&local_c0);
    poVar2 = std::operator<<(poVar2,") with the following output:\n");
    std::operator<<(poVar2,(string *)local_80);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    lVar3 = std::__cxx11::string::find(local_80,0x791a02);
    if (lVar3 == -1) {
      std::operator<<((ostream *)&std::cout,(string *)local_80);
    }
  }
  bVar1 = local_92;
  std::__cxx11::string::~string((string *)local_80);
  return (bool)(bVar1 & 1);
}

Assistant:

static bool RunCommand(const char* comment, std::vector<std::string>& command,
                       bool verbose, NumberFormat exitFormat,
                       int* retCodeOut = nullptr,
                       bool (*retCodeOkay)(int) = nullptr)
{
  if (verbose) {
    std::cout << comment << ":\n";
    std::cout << cmJoin(command, " ") << "\n";
  }
  std::string output;
  int retCode = 0;
  bool commandResult = cmSystemTools::RunSingleCommand(
    command, &output, &output, &retCode, nullptr, cmSystemTools::OUTPUT_NONE);
  bool const retCodeSuccess =
    retCode == 0 || (retCodeOkay && retCodeOkay(retCode));
  bool const success = commandResult && retCodeSuccess;
  if (retCodeOut) {
    if (commandResult || !retCodeSuccess) {
      *retCodeOut = retCode;
    } else {
      *retCodeOut = -1;
    }
  }
  if (!success) {
    std::cout << comment << ": command \"" << cmJoin(command, " ")
              << "\" failed (exit code "
              << NumberFormatter(exitFormat, retCode)
              << ") with the following output:\n"
              << output;
  } else {
    // always print the output of the command, unless
    // it is the dumb rc command banner
    if (output.find("Resource Compiler Version") == std::string::npos) {
      std::cout << output;
    }
  }
  return success;
}